

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = (window->Scroll).x;
  fVar4 = (window->Scroll).y;
  fVar6 = (window->ScrollTarget).x;
  if (fVar6 < 3.4028235e+38) {
    fVar7 = (window->ScrollbarSizes).x;
    fVar2 = (window->ScrollTargetCenterRatio).x;
    fVar5 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar5) {
      if (fVar6 <= fVar5) {
        fVar6 = fVar6 * fVar2 + 0.0;
      }
      else {
        fVar8 = ((window->ScrollMax).x + (window->SizeFull).x) - fVar7;
        if (fVar8 - fVar5 <= fVar6) {
          fVar6 = fVar6 + (fVar8 - fVar6) * fVar2;
        }
      }
    }
    fVar7 = fVar6 - fVar2 * ((window->SizeFull).x - fVar7);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar6 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar5 = fVar4 + fVar6 + (window->ScrollbarSizes).y;
    fVar4 = (window->ScrollTarget).y;
    fVar6 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (0.0 < fVar2) {
      if (fVar4 <= fVar2) {
        fVar4 = fVar4 * fVar6 + 0.0;
      }
      else {
        fVar8 = ((window->ScrollMax).y + (window->SizeFull).y) - fVar5;
        if (fVar8 - fVar2 <= fVar4) {
          fVar4 = fVar4 + (fVar8 - fVar4) * fVar6;
        }
      }
    }
    fVar4 = fVar4 - fVar6 * ((window->SizeFull).y - fVar5);
  }
  fVar7 = (float)(int)(float)(-(uint)(0.0 <= fVar7) & (uint)fVar7);
  fVar6 = (float)(int)(float)(-(uint)(0.0 <= fVar4) & (uint)fVar4);
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar4 = (window->ScrollMax).x;
    if (fVar4 <= fVar7) {
      fVar7 = fVar4;
    }
    fVar4 = (window->ScrollMax).y;
    if (fVar4 <= fVar6) {
      fVar6 = fVar4;
    }
  }
  IVar3.y = fVar6;
  IVar3.x = fVar7;
  return IVar3;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float decoration_total_width = window->ScrollbarSizes.x;
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
        {
            float snap_x_min = 0.0f;
            float snap_x_max = window->ScrollMax.x + window->SizeFull.x - decoration_total_width;
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        }
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - decoration_total_width);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_total_height = window->TitleBarHeight() + window->MenuBarHeight() + window->ScrollbarSizes.y;
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
        {
            float snap_y_min = 0.0f;
            float snap_y_max = window->ScrollMax.y + window->SizeFull.y - decoration_total_height;
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        }
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - decoration_total_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}